

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleValue.cpp
# Opt level: O0

void __thiscall bubbleJson::BubbleValue::MemoryFreeValue(BubbleValue *this)

{
  ValueTypes VVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *pmVar2;
  vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_> *this_00;
  bool bVar3;
  size_type sVar4;
  reference this_01;
  pointer ppVar5;
  ulong uVar6;
  _Self local_30;
  _Self local_28;
  iterator it;
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *members;
  BubbleValue *this_local;
  
  pmVar2 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
            *)(this->u).string.literal;
  VVar1 = this->type;
  if (VVar1 == ValueType_String) {
    free((this->u).string.literal);
    (this->u).number = 0.0;
  }
  else if (VVar1 == ValueType_Array) {
    for (it._M_node._4_4_ = 0; uVar6 = (ulong)it._M_node._4_4_,
        sVar4 = std::vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>::size
                          ((vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>
                            *)(this->u).string.literal), uVar6 < sVar4;
        it._M_node._4_4_ = it._M_node._4_4_ + 1) {
      this_01 = std::vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>::at
                          ((vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>
                            *)(this->u).string.literal,(long)it._M_node._4_4_);
      MemoryFreeValue(this_01);
    }
    this_00 = (vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_> *)
              (this->u).string.literal;
    if (this_00 != (vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_> *)0x0)
    {
      std::vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>::~vector
                (this_00);
      ::operator_delete(this_00);
    }
    (this->u).number = 0.0;
  }
  else if (VVar1 == ValueType_Object) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
         ::begin(pmVar2);
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
           ::end(pmVar2);
      bVar3 = std::operator!=(&local_28,&local_30);
      if (!bVar3) break;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>
               ::operator->(&local_28);
      MemoryFreeValue(&ppVar5->second);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>
      ::operator++(&local_28);
    }
    pmVar2 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
              *)(this->u).string.literal;
    if (pmVar2 != (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                   *)0x0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
      ::~map(pmVar2);
      ::operator_delete(pmVar2);
    }
    (this->u).number = 0.0;
  }
  this->type = ValueType_Null;
  return;
}

Assistant:

void BubbleValue::MemoryFreeValue()
{
    auto members = this->u.object.members;
    switch (this->type)
    {
        case ValueType_String:
            free(this->u.string.literal);
            this->u.string.literal = nullptr;
            break;
        case ValueType_Array:
            for (int i = 0; i < this->u.array.elements->size(); ++i)
            {
                this->u.array.elements->at(i).MemoryFreeValue();
            }
            delete this->u.array.elements;
            this->u.array.elements = nullptr;
            break;
        case ValueType_Object:
            for (auto it = members->begin(); it != members->end(); ++it)
            {
                it->second.MemoryFreeValue();
            }
            delete this->u.object.members;
            this->u.object.members = nullptr;
            break;
        default:
            break;
    }

    this->type = ValueType_Null;
}